

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O0

size_t __thiscall CTxMemPool::DynamicMemoryUsage(CTxMemPool *this)

{
  long lVar1;
  size_t sVar2;
  size_type sVar3;
  long lVar4;
  size_t sVar5;
  long in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
  *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
  *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffffb0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff78);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff98 >> 0x18,0));
  sVar2 = memusage::MallocUsage(in_stack_ffffffffffffff80);
  sVar3 = boost::multi_index::detail::
          hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
          ::size(in_stack_ffffffffffffff78);
  lVar4 = sVar2 * sVar3;
  sVar2 = memusage::DynamicUsage<COutPoint,CTransaction_const*>
                    ((indirectmap<COutPoint,_const_CTransaction_*> *)in_stack_ffffffffffffff88);
  lVar4 = lVar4 + sVar2;
  sVar2 = memusage::DynamicUsage<uint256,long,std::less<uint256>>(in_stack_ffffffffffffff88);
  sVar5 = memusage::DynamicUsage<std::shared_ptr<CTransaction_const>>
                    ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)in_stack_ffffffffffffff78);
  sVar2 = lVar4 + sVar2 + sVar5 + *(long *)(in_RDI + 0x18);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return sVar2;
  }
  __stack_chk_fail();
}

Assistant:

size_t CTxMemPool::DynamicMemoryUsage() const {
    LOCK(cs);
    // Estimate the overhead of mapTx to be 15 pointers + an allocation, as no exact formula for boost::multi_index_contained is implemented.
    return memusage::MallocUsage(sizeof(CTxMemPoolEntry) + 15 * sizeof(void*)) * mapTx.size() + memusage::DynamicUsage(mapNextTx) + memusage::DynamicUsage(mapDeltas) + memusage::DynamicUsage(txns_randomized) + cachedInnerUsage;
}